

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O3

bool __thiscall
duckdb::WindowGlobalSourceState::TryNextTask(WindowGlobalSourceState *this,TaskPtr *task)

{
  StateWithBlockableTasks *this_00;
  atomic<unsigned_long> *paVar1;
  size_type __n;
  size_type *psVar2;
  iterator __position;
  bool bVar3;
  type pWVar4;
  reference pvVar5;
  pointer pWVar6;
  reference pvVar7;
  unsigned_long *group_idx;
  size_type *psVar8;
  unsigned_long group_idx_1;
  unique_lock<std::mutex> guard;
  unsigned_long local_48;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &(this->super_GlobalSourceState).super_StateWithBlockableTasks.lock;
  local_40._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  FinishTask(this,(TaskPtr)task->ptr);
  if ((((this->stopped)._M_base._M_i & 1U) == 0) &&
     ((this->started).super___atomic_base<unsigned_long>._M_i < this->total_tasks)) {
    pWVar4 = unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
             ::operator*(&this->gsink->global_partition);
    this_00 = &(this->super_GlobalSourceState).super_StateWithBlockableTasks;
    psVar8 = (this->active_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar2 = (this->active_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (psVar8 != psVar2) {
      do {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>,_true>
                 ::operator[](&pWVar4->window_hash_groups,*psVar8);
        pWVar6 = unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>
                 ::operator->(pvVar5);
        bVar3 = WindowHashGroup::TryPrepareNextStage(pWVar6);
        if (bVar3) {
          StateWithBlockableTasks::UnblockTasks(this_00,&local_40);
        }
        pWVar6 = unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>
                 ::operator->(pvVar5);
        bVar3 = WindowHashGroup::TryNextTask(pWVar6,task);
        if (bVar3) goto LAB_01648433;
        psVar8 = psVar8 + 1;
      } while (psVar8 != psVar2);
    }
    if ((this->next_group).super___atomic_base<unsigned_long>._M_i <
        (ulong)((long)(this->partition_blocks).
                      super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      .
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->partition_blocks).
                      super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      .
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4)) {
      do {
        LOCK();
        paVar1 = &this->next_group;
        __n = (paVar1->super___atomic_base<unsigned_long>)._M_i;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
        UNLOCK();
        pvVar7 = vector<std::pair<unsigned_long,_unsigned_long>,_true>::operator[]
                           (&this->partition_blocks,__n);
        local_48 = pvVar7->second;
        __position._M_current =
             (this->active_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->active_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->active_groups,
                     __position,&local_48);
        }
        else {
          *__position._M_current = local_48;
          (this->active_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        pvVar5 = vector<duckdb::unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>,_true>
                 ::operator[](&pWVar4->window_hash_groups,local_48);
        pWVar6 = unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>
                 ::operator->(pvVar5);
        bVar3 = WindowHashGroup::TryPrepareNextStage(pWVar6);
        if (bVar3) {
          StateWithBlockableTasks::UnblockTasks(this_00,&local_40);
        }
        pWVar6 = unique_ptr<duckdb::WindowHashGroup,_std::default_delete<duckdb::WindowHashGroup>,_true>
                 ::operator->(pvVar5);
        bVar3 = WindowHashGroup::TryNextTask(pWVar6,task);
        if (bVar3) goto LAB_01648433;
      } while ((this->next_group).super___atomic_base<unsigned_long>._M_i <
               (ulong)((long)(this->partition_blocks).
                             super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             .
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->partition_blocks).
                             super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             .
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
  }
  task->ptr = (WindowSourceTask *)0x0;
  bVar3 = false;
LAB_01648418:
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return bVar3;
LAB_01648433:
  LOCK();
  (this->started).super___atomic_base<unsigned_long>._M_i =
       (this->started).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  bVar3 = true;
  goto LAB_01648418;
}

Assistant:

bool WindowGlobalSourceState::TryNextTask(TaskPtr &task) {
	auto guard = Lock();
	FinishTask(task);

	if (!HasMoreTasks()) {
		task = nullptr;
		return false;
	}

	//	Run through the active groups looking for one that can assign a task
	auto &gpart = *gsink.global_partition;
	for (const auto &group_idx : active_groups) {
		auto &window_hash_group = gpart.window_hash_groups[group_idx];
		if (window_hash_group->TryPrepareNextStage()) {
			UnblockTasks(guard);
		}
		if (window_hash_group->TryNextTask(task)) {
			++started;
			return true;
		}
	}

	//	All active groups are busy or blocked, so start the next one (if any)
	while (next_group < partition_blocks.size()) {
		const auto group_idx = partition_blocks[next_group++].second;
		active_groups.emplace_back(group_idx);

		auto &window_hash_group = gpart.window_hash_groups[group_idx];
		if (window_hash_group->TryPrepareNextStage()) {
			UnblockTasks(guard);
		}
		if (!window_hash_group->TryNextTask(task)) {
			//	Group has no tasks (empty?)
			continue;
		}

		++started;
		return true;
	}

	task = nullptr;

	return false;
}